

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall p2t::Sweep::FillBasin(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  Point *pPVar2;
  Node *pNVar3;
  double dVar4;
  Node *pNVar5;
  Node *node_00;
  Node *pNVar6;
  double dVar7;
  
  pNVar5 = node->next;
  pPVar2 = pNVar5->next->point;
  dVar7 = pPVar2->x;
  dVar4 = pPVar2->y;
  dVar7 = (pNVar5->point->y - dVar4) * (node->point->x - dVar7) -
          (pNVar5->point->x - dVar7) * (node->point->y - dVar4);
  if (1e-12 <= ABS(dVar7) && 0.0 < dVar7) {
    pNVar5 = pNVar5->next;
  }
  (tcx->basin).left_node = pNVar5;
  pNVar3 = pNVar5;
  do {
    node_00 = pNVar3;
    (tcx->basin).bottom_node = node_00;
    pNVar3 = node_00->next;
    if (pNVar3 == (Node *)0x0) break;
  } while (pNVar3->point->y <= node_00->point->y);
  pNVar3 = node_00;
  if (node_00 != pNVar5) {
    do {
      pNVar6 = pNVar3;
      (tcx->basin).right_node = pNVar6;
      pNVar3 = pNVar6->next;
      if (pNVar3 == (Node *)0x0) break;
      dVar7 = pNVar3->point->y;
      pdVar1 = &pNVar6->point->y;
    } while (*pdVar1 <= dVar7 && dVar7 != *pdVar1);
    if (pNVar6 != node_00) {
      (tcx->basin).width = pNVar6->point->x - pNVar5->point->x;
      dVar7 = pNVar5->point->y;
      pdVar1 = &pNVar6->point->y;
      (tcx->basin).left_highest = *pdVar1 <= dVar7 && dVar7 != *pdVar1;
      FillBasinReq(this,tcx,node_00);
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillBasin(SweepContext& tcx, Node& node)
{
  if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
    tcx.basin.left_node = node.next->next;
  } else {
    tcx.basin.left_node = node.next;
  }

  // Find the bottom and right node
  tcx.basin.bottom_node = tcx.basin.left_node;
  while (tcx.basin.bottom_node->next
         && tcx.basin.bottom_node->point->y >= tcx.basin.bottom_node->next->point->y) {
    tcx.basin.bottom_node = tcx.basin.bottom_node->next;
  }
  if (tcx.basin.bottom_node == tcx.basin.left_node) {
    // No valid basin
    return;
  }

  tcx.basin.right_node = tcx.basin.bottom_node;
  while (tcx.basin.right_node->next
         && tcx.basin.right_node->point->y < tcx.basin.right_node->next->point->y) {
    tcx.basin.right_node = tcx.basin.right_node->next;
  }
  if (tcx.basin.right_node == tcx.basin.bottom_node) {
    // No valid basins
    return;
  }

  tcx.basin.width = tcx.basin.right_node->point->x - tcx.basin.left_node->point->x;
  tcx.basin.left_highest = tcx.basin.left_node->point->y > tcx.basin.right_node->point->y;

  FillBasinReq(tcx, tcx.basin.bottom_node);
}